

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CD_Scene.h
# Opt level: O2

Scalar __thiscall sch::CD_Scene::getWitnessPoints(CD_Scene *this,int a,int b,Point3 *p1,Point3 *p2)

{
  double *pdVar1;
  undefined8 uVar2;
  long lVar3;
  double dVar4;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  
  uVar7 = 0;
  uVar8 = 0;
  if (a != b) {
    lVar5 = (long)a * 0x18;
    lVar3 = *(long *)(*(long *)(this + 0x38) + lVar5);
    lVar6 = (long)b * 0x18;
    p1->m_z = *(double *)(lVar3 + 0x10 + lVar6);
    pdVar1 = (double *)(lVar3 + lVar6);
    dVar4 = pdVar1[1];
    p1->m_x = *pdVar1;
    p1->m_y = dVar4;
    lVar3 = *(long *)(*(long *)(this + 0x38) + lVar6);
    p2->m_z = *(double *)(lVar3 + 0x10 + lVar5);
    pdVar1 = (double *)(lVar3 + lVar5);
    dVar4 = pdVar1[1];
    p2->m_x = *pdVar1;
    p2->m_y = dVar4;
    uVar2 = *(undefined8 *)(*(long *)(*(long *)(this + 0x50) + lVar5) + (long)b * 8);
    uVar7 = (undefined4)uVar2;
    uVar8 = (undefined4)((ulong)uVar2 >> 0x20);
  }
  return (Scalar)CONCAT44(uVar8,uVar7);
}

Assistant:

SCH_API Scalar getWitnessPoints(int a, int b, Point3 & p1, Point3 & p2)
  {
    if(a != b)
    {
      p1 = witness_[a][b];
      p2 = witness_[b][a];
      return distances_[a][b];
    }
    else
    {
      return 0;
    }
  }